

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O0

void pzshape::TPZShapeCube::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  TPZVec<long> *this;
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  long *plVar4;
  TPZGenMatrix<int> *in_RCX;
  int in_EDX;
  TPZVec<long> *in_RSI;
  int in_EDI;
  int il;
  TPZGenMatrix<int> locshapeorders;
  int nshape_1;
  int node;
  TPZManVector<long,_4> locid;
  int nnodes;
  TPZStack<int,_10> lowersides;
  int ioy;
  int nshape;
  int c;
  int b;
  int a;
  int k;
  int j;
  int i;
  int count;
  int nsei;
  size_t in_stack_00000278;
  char *in_stack_00000280;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  TPZManVector<long,_4> *in_stack_fffffffffffffe60;
  TPZGenMatrix<int> *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  int64_t in_stack_fffffffffffffe78;
  TPZManVector<long,_4> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined8 in_stack_fffffffffffffe90;
  TPZVec<long> *in_stack_fffffffffffffe98;
  long in_stack_fffffffffffffea0;
  int iVar5;
  int local_104;
  int local_e4;
  TPZVec<long> local_e0 [2];
  int local_a0;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_14;
  TPZVec<long> *local_10;
  int local_4;
  
  if (in_EDI < 8) {
    iVar2 = TPZGenMatrix<int>::Rows(in_RCX);
    if (iVar2 != 1) {
      pzinternal::DebugStopImpl(in_stack_00000280,in_stack_00000278);
    }
    piVar3 = TPZGenMatrix<int>::operator()
                       (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    *piVar3 = 1;
    piVar3 = TPZGenMatrix<int>::operator()
                       (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    *piVar3 = 0;
    piVar3 = TPZGenMatrix<int>::operator()
                       (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    *piVar3 = 0;
  }
  else {
    local_14 = in_EDX;
    if (in_EDI == 0x1a) {
      local_24 = (in_EDX + -1) * (in_EDX + -1) * (in_EDX + -1);
      iVar2 = TPZGenMatrix<int>::Rows(in_RCX);
      if (iVar2 != local_24) {
        pzinternal::DebugStopImpl(in_stack_00000280,in_stack_00000278);
      }
      local_28 = 0;
      for (local_2c = 2; local_2c < local_14 + 1; local_2c = local_2c + 1) {
        for (local_30 = 2; local_30 < local_14 + 1; local_30 = local_30 + 1) {
          for (local_34 = 2; iVar1 = local_2c, local_34 < local_14 + 1; local_34 = local_34 + 1) {
            local_38 = local_2c;
            local_3c = local_30;
            local_40 = local_34;
            piVar3 = TPZGenMatrix<int>::operator()
                               (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                                CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
            iVar5 = local_3c;
            *piVar3 = iVar1;
            piVar3 = TPZGenMatrix<int>::operator()
                               (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                                CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
            iVar1 = local_40;
            *piVar3 = iVar5;
            piVar3 = TPZGenMatrix<int>::operator()
                               (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                                CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
            *piVar3 = iVar1;
            local_28 = local_28 + 1;
          }
        }
      }
    }
    else if ((in_EDI < 8) || (0x13 < in_EDI)) {
      local_10 = in_RSI;
      local_4 = in_EDI;
      iVar2 = TPZGenMatrix<int>::Rows(in_RCX);
      if (iVar2 != (local_14 + -1) * (local_14 + -1)) {
        pzinternal::DebugStopImpl(in_stack_00000280,in_stack_00000278);
      }
      TPZStack<int,_10>::TPZStack
                ((TPZStack<int,_10> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))
      ;
      pztopology::TPZCube::LowerDimensionSides
                (in_stack_fffffffffffffe74,(TPZStack<int,_10> *)in_stack_fffffffffffffe68);
      TPZStack<int,_10>::Push
                ((TPZStack<int,_10> *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      local_a0 = pztopology::TPZCube::NSideNodes(local_4);
      TPZManVector<long,_4>::TPZManVector(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      local_e4 = 0;
      while( true ) {
        iVar5 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
        iVar2 = TPZVec<long>::size(local_e0);
        this = local_10;
        iVar1 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
        if (iVar2 <= local_e4) break;
        iVar1 = pztopology::TPZCube::ContainedSideLocId
                          (in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20)
                          );
        plVar4 = TPZVec<long>::operator[](this,(long)iVar1);
        in_stack_fffffffffffffea0 = *plVar4;
        plVar4 = TPZVec<long>::operator[](local_e0,(long)local_e4);
        *plVar4 = in_stack_fffffffffffffea0;
        local_e4 = local_e4 + 1;
      }
      TPZGenMatrix<int>::TPZGenMatrix
                ((TPZGenMatrix<int> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      TPZShapeQuad::SideShapeOrder
                (iVar5,in_stack_fffffffffffffe98,iVar1,
                 (TPZGenMatrix<int> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
      ;
      for (local_104 = 0; local_104 < (local_14 + -1) * (local_14 + -1); local_104 = local_104 + 1)
      {
        piVar3 = TPZGenMatrix<int>::operator()
                           (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        iVar1 = *piVar3;
        piVar3 = TPZGenMatrix<int>::operator()
                           (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        *piVar3 = iVar1;
        piVar3 = TPZGenMatrix<int>::operator()
                           (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        iVar1 = *piVar3;
        piVar3 = TPZGenMatrix<int>::operator()
                           (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        *piVar3 = iVar1;
        in_stack_fffffffffffffe68 =
             (TPZGenMatrix<int> *)
             TPZGenMatrix<int>::operator()
                       (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        in_stack_fffffffffffffe5c = *(int *)&in_stack_fffffffffffffe68->fMem;
        in_stack_fffffffffffffe60 =
             (TPZManVector<long,_4> *)
             TPZGenMatrix<int>::operator()
                       (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                        CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        *(int *)&(in_stack_fffffffffffffe60->super_TPZVec<long>)._vptr_TPZVec =
             in_stack_fffffffffffffe5c;
      }
      TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)in_stack_fffffffffffffe60);
      TPZManVector<long,_4>::~TPZManVector(in_stack_fffffffffffffe60);
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1877f1a);
    }
    else {
      local_44 = in_EDX + -1;
      iVar2 = TPZGenMatrix<int>::Rows(in_RCX);
      if (iVar2 != local_44) {
        pzinternal::DebugStopImpl(in_stack_00000280,in_stack_00000278);
      }
      for (local_48 = 0; local_48 < local_14 + -1; local_48 = local_48 + 1) {
        iVar1 = local_48 + 2;
        piVar3 = TPZGenMatrix<int>::operator()
                           (in_stack_fffffffffffffe68,(int64_t)in_stack_fffffffffffffe60,
                            CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        *piVar3 = iVar1;
      }
    }
  }
  return;
}

Assistant:

void TPZShapeCube::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=7)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side == 26)
        {
            int nsei = (order-1)*(order-1)*(order-1);
            if (shapeorders.Rows() != nsei) {
                DebugStop();
            }
            int count = 0;
            for (int i=2; i<order+1; i++) {
                for (int j=2; j<order+1; j++) {
                    for (int k=2; k<order+1; k++) {
                        int a = i;
                        int b = j;
                        int c = k;
                        shapeorders(count,0) = a;
                        shapeorders(count,1) = b;
                        shapeorders(count,2) = c;
                        count++;

                    }
                    
                }
            }
        }
        else if (side>7 && side<20)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else
        {

            if (shapeorders.Rows() != (order-1)*(order-1))
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            //TPZVec<int> locsideorder(lowersides.size(),order);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];// SideNodeLocId( side, node);
            }// sera que esta pegando os ids corretos mesmo? 
            
            int nshape = (order-1)*(order-1);
            TPZGenMatrix<int> locshapeorders(nshape,3);

            
            TPZShapeQuad::SideShapeOrder(8,locid, order, locshapeorders);
            
            // temos que arrumar a saida de locshapeorders para adequar a orientacao dos vetores que geram
            // a face do lado side
            
            // aqui o locshapeorders esta armazenado so para x e y
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
           
        }

    }